

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O0

void __thiscall
World_3df::inverse(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  double dVar1;
  bool bVar2;
  type pFVar3;
  type pPVar4;
  creat_t *pcVar5;
  double dVar6;
  const_reference pvVar7;
  type pCVar8;
  uint64_t uVar9;
  ostream *poVar10;
  Msg local_638;
  undefined1 local_608 [24];
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [32];
  Msg local_5a8;
  Msg local_578;
  Msg local_548;
  Msg local_518;
  Msg local_4e8;
  undefined1 local_4b8 [24];
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [32];
  Msg local_3b8;
  Msg local_388;
  Msg local_358;
  Msg local_328;
  Msg local_2f8;
  Msg local_2c8;
  Msg local_298;
  Msg local_268;
  Msg local_238;
  Msg local_208;
  Msg local_1d8;
  Msg local_1a8;
  Msg local_178;
  undefined1 local_148 [24];
  double m2;
  size_t p2;
  size_t p1;
  double m1;
  size_t i;
  size_t mccc;
  size_t mcc;
  string local_f8 [48];
  Msg local_c8;
  Msg local_98;
  Msg local_68;
  pointer local_28;
  double prob;
  shared_ptr<Population> *dst_local;
  shared_ptr<Population> *param_1_local;
  World_3df *this_local;
  
  local_28 = (pointer)0x3f50624dd2f1a9fc;
  prob = (double)dst;
  dst_local = param_1;
  param_1_local = (shared_ptr<Population> *)this;
  World::get_log((World *)&stack0xffffffffffffffc8);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffc8);
  util::logging::Msg::Msg(&local_c8,"Inwersja z p_i = ",L_NORM);
  util::logging::Msg::operator+(&local_98,&local_c8,0.001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"...",(allocator *)((long)&mcc + 7));
  util::logging::Msg::operator+(&local_68,&local_98,(string *)local_f8);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_68);
  util::logging::Msg::~Msg(&local_68);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mcc + 7));
  util::logging::Msg::~Msg(&local_98);
  util::logging::Msg::~Msg(&local_c8);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffc8);
  mccc = 0;
  i = 0;
  pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
  m1 = (double)pPVar4->ELITE_SIZE;
  while( true ) {
    dVar1 = m1;
    pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
    pcVar5 = Population::get_creatures(pPVar4);
    dVar6 = (double)std::
                    vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                    ::size(pcVar5);
    if ((ulong)dVar6 <= (ulong)dVar1) break;
    bVar2 = probability(0.001);
    if (bVar2) {
      pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
      pcVar5 = Population::get_creatures(pPVar4);
      pvVar7 = std::
               vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
               operator[](pcVar5,(size_type)m1);
      pCVar8 = boost::shared_ptr<Creature>::operator->(pvVar7);
      p1 = (size_t)Creature::get_fitness(pCVar8);
      p2 = frand(0x18);
      uVar9 = frand(0x18);
      m2 = (double)(uVar9 + 0x1a);
      pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
      (*pPVar4->_vptr_Population[5])(pPVar4,m1,p2,m2);
      pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
      pcVar5 = Population::get_creatures(pPVar4);
      pvVar7 = std::
               vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
               operator[](pcVar5,(size_type)m1);
      pCVar8 = boost::shared_ptr<Creature>::operator->(pvVar7);
      local_148._16_8_ = Creature::get_fitness(pCVar8);
      World::get_log((World *)local_148);
      pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                         ((shared_ptr<util::logging::File_logger> *)local_148);
      util::logging::Msg::Msg(&local_3b8,anon_var_dwarf_2acd6,L_NORM);
      util::logging::Msg::operator+(&local_388,&local_3b8,(longlong)m1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,anon_var_dwarf_2ad42,&local_3d9);
      util::logging::Msg::operator+(&local_358,&local_388,(string *)local_3d8);
      util::logging::Msg::operator+(&local_328,&local_358,(long)m2 - p2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,anon_var_dwarf_2ad58,&local_401);
      util::logging::Msg::operator+(&local_2f8,&local_328,(string *)local_400);
      util::logging::Msg::operator+(&local_2c8,&local_2f8,p2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428," a ",&local_429);
      util::logging::Msg::operator+(&local_298,&local_2c8,(string *)local_428);
      util::logging::Msg::operator+(&local_268,&local_298,(longlong)m2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450," {",&local_451);
      util::logging::Msg::operator+(&local_238,&local_268,(string *)local_450);
      util::logging::Msg::operator+(&local_208,&local_238,(double)p1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478," -> ",&local_479);
      util::logging::Msg::operator+(&local_1d8,&local_208,(string *)local_478);
      util::logging::Msg::operator+(&local_1a8,&local_1d8,(double)local_148._16_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,"}",(allocator *)(local_4b8 + 0x17));
      util::logging::Msg::operator+(&local_178,&local_1a8,(string *)local_4a0);
      (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_178);
      util::logging::Msg::~Msg(&local_178);
      std::__cxx11::string::~string(local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)(local_4b8 + 0x17));
      util::logging::Msg::~Msg(&local_1a8);
      util::logging::Msg::~Msg(&local_1d8);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      util::logging::Msg::~Msg(&local_208);
      util::logging::Msg::~Msg(&local_238);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      util::logging::Msg::~Msg(&local_268);
      util::logging::Msg::~Msg(&local_298);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      util::logging::Msg::~Msg(&local_2c8);
      util::logging::Msg::~Msg(&local_2f8);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      util::logging::Msg::~Msg(&local_328);
      util::logging::Msg::~Msg(&local_358);
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      util::logging::Msg::~Msg(&local_388);
      util::logging::Msg::~Msg(&local_3b8);
      boost::shared_ptr<util::logging::File_logger>::~shared_ptr
                ((shared_ptr<util::logging::File_logger> *)local_148);
      poVar10 = std::operator<<((ostream *)&std::cout,"!! Inwersja na ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(ulong)m1);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      mccc = mccc + 1;
      i = ((long)m2 - p2) + i;
    }
    m1 = (double)((long)m1 + 1);
  }
  World::get_log((World *)local_4b8);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_4b8);
  util::logging::Msg::Msg(&local_5a8,"... W sumie ",L_NORM);
  util::logging::Msg::operator+(&local_578,&local_5a8,mccc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8," inwersji na ",&local_5c9);
  util::logging::Msg::operator+(&local_548,&local_578,(string *)local_5c8);
  util::logging::Msg::operator+(&local_518,&local_548,i);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0," genach",(allocator *)(local_608 + 0x17));
  util::logging::Msg::operator+(&local_4e8,&local_518,(string *)local_5f0);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_4e8);
  util::logging::Msg::~Msg(&local_4e8);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_608 + 0x17));
  util::logging::Msg::~Msg(&local_518);
  util::logging::Msg::~Msg(&local_548);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  util::logging::Msg::~Msg(&local_578);
  util::logging::Msg::~Msg(&local_5a8);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_4b8);
  World::get_log((World *)local_608);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_608);
  util::logging::Msg::Msg(&local_638,anon_var_dwarf_2ac38,L_NORM);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_638);
  util::logging::Msg::~Msg(&local_638);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_608);
  return;
}

Assistant:

void World_3df::inverse( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.001;

	(*get_log()) << util::logging::Msg("Inwersja z p_i = ") + prob + "...";

	size_t mcc = 0, mccc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		if(probability(prob))
		{
			double m1 = dst->get_creatures()[i]->get_fitness();
			size_t p1 = frand(CHROMSIZE / 2 - 1), p2 = (CHROMSIZE / 2 + 1) + frand(CHROMSIZE / 2 - 1);

			dst->inverse(i, p1, p2);

			double m2 = dst->get_creatures()[i]->get_fitness();

			(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i)
					+ "] zaliczył inwersję na " + static_cast<long long> (p2 - p1) + " genach między "
					+ static_cast<long long> (p1) + " a " + static_cast<long long> (p2) + " {" + m1 + " -> " + m2 + "}";

			std::cout << "!! Inwersja na " << i << std::endl;

			mcc++;
			mccc += p2 - p1;
		}

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " inwersji na "
			+ static_cast<long long> (mccc) + " genach";

	(*get_log()) << "Już";
}